

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::resolve(Tree *this)

{
  pfn_error p_Var1;
  size_t sVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  error_flags eVar12;
  int iVar13;
  NodeData *pNVar14;
  csubstr *pcVar15;
  csubstr *pcVar16;
  Tree *in_RDI;
  refdata *ar;
  iterator __end2_1;
  iterator __begin2_1;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *__range2_1;
  char msg_9 [33];
  char msg_8 [39];
  char msg_7 [37];
  char msg_6 [56];
  char msg_5 [33];
  char msg_4 [39];
  char msg_3 [71];
  char msg_2 [36];
  size_t after_1;
  size_t p_1;
  char msg_1 [35];
  size_t p;
  size_t after;
  char msg [38];
  refdata *rd;
  iterator __end2;
  iterator __begin2;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *__range2;
  size_t prev_parent_ref_after;
  size_t prev_parent_ref;
  ReferenceResolver rr;
  undefined4 in_stack_fffffffffffff3d8;
  undefined4 in_stack_fffffffffffff3dc;
  undefined4 in_stack_fffffffffffff3e0;
  undefined4 in_stack_fffffffffffff3e4;
  undefined4 in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3ec;
  undefined4 in_stack_fffffffffffff3f0;
  undefined4 in_stack_fffffffffffff3f4;
  Tree *in_stack_fffffffffffff3f8;
  ReferenceResolver *in_stack_fffffffffffff400;
  undefined7 in_stack_fffffffffffff408;
  undefined1 in_stack_fffffffffffff40f;
  NodeData *in_stack_fffffffffffff428;
  Tree *in_stack_fffffffffffff430;
  Tree *in_stack_fffffffffffff438;
  Tree *in_stack_fffffffffffff440;
  undefined6 in_stack_fffffffffffff448;
  undefined1 in_stack_fffffffffffff44e;
  undefined1 in_stack_fffffffffffff44f;
  NodeData *in_stack_fffffffffffff450;
  basic_substring<const_char> *in_stack_fffffffffffff458;
  NodeType_e local_988;
  iterator local_980;
  iterator local_978;
  iterator local_970;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *local_968;
  undefined4 local_960;
  undefined4 uStack_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  undefined4 local_950;
  undefined4 uStack_94c;
  undefined4 uStack_948;
  undefined4 uStack_944;
  Tree *local_940;
  Tree local_938;
  char local_838 [56];
  char *local_800;
  size_t local_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  Tree *local_7d0;
  char local_7c8 [40];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  Tree *local_780;
  char local_778 [40];
  char *local_750;
  size_t local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  Tree *local_720;
  char local_718 [72];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  Tree *local_6b0;
  char local_6a8 [40];
  size_t local_680;
  size_t local_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  Tree *local_650;
  char local_648 [40];
  size_t local_620;
  size_t local_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  Tree *local_5f0;
  char local_5e8 [48];
  iterator local_5b8;
  iterator local_5b0;
  iterator local_598;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *local_590;
  size_t local_588;
  size_t local_580;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> local_570;
  undefined8 local_230;
  NodeType_e *local_228;
  size_t local_220;
  NodeData *local_210;
  size_t local_208;
  NodeData *local_1f8;
  char *local_1f0;
  size_t local_1e8;
  csubstr *local_1e0;
  char *local_1d8;
  size_t local_1d0;
  char *local_1c8;
  size_t local_1c0;
  csubstr *local_1b8;
  char *local_1b0;
  size_t local_1a8;
  char *local_1a0;
  size_t local_198;
  csubstr *local_190;
  char *local_188;
  size_t local_180;
  size_t local_178;
  size_t local_168;
  size_t local_158;
  iterator local_148;
  size_t local_140;
  size_t local_130;
  char *local_120;
  csubstr *local_118;
  NodeData *local_110;
  NodeData *local_108;
  iterator local_100;
  size_t local_f8;
  size_t local_e8;
  size_t local_d8;
  size_t local_c8;
  size_t local_b8;
  size_t local_a8;
  iterator local_98;
  NodeData *local_90;
  NodeData *local_88;
  NodeData *local_80;
  NodeData *local_78;
  NodeData *local_70;
  NodeData *local_68;
  NodeData *local_60;
  NodeData *local_58;
  NodeData *local_50;
  csubstr *local_48;
  char *local_40;
  size_t local_38;
  csubstr *local_30;
  char *local_28;
  size_t local_20;
  csubstr *local_18;
  char *local_10;
  size_t local_8;
  
  if (in_RDI->m_size != 0) {
    detail::ReferenceResolver::ReferenceResolver
              (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
    local_580 = 0xffffffffffffffff;
    local_588 = 0xffffffffffffffff;
    local_590 = &local_570;
    local_598 = detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::begin(local_590);
    local_5b0 = detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::end(local_590);
    for (; local_598 != local_5b0; local_598 = local_598 + 1) {
      local_5b8 = local_598;
      local_148 = local_598;
      if (((local_598->type).type & (VALREF|KEYREF)) != NOTYPE) {
        if (local_598->parent_ref == 0xffffffffffffffff) {
          local_220 = local_598->node;
          local_210 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
          if (((local_210->m_type).type & KEY) != NOTYPE) {
            local_130 = local_5b8->node;
            local_110 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            if (((local_110->m_type).type & KEYREF) != NOTYPE) {
              local_118 = key(in_stack_fffffffffffff438,(size_t)in_stack_fffffffffffff430);
              local_120 = "<<";
              iVar13 = basic_substring<const_char>::compare
                                 (in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450,
                                  CONCAT17(in_stack_fffffffffffff44f,
                                           CONCAT16(in_stack_fffffffffffff44e,
                                                    in_stack_fffffffffffff448)));
              if (iVar13 == 0) {
                local_158 = local_5b8->node;
                local_80 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
                if (((local_80->m_type).type & KEYVAL) != KEYVAL) {
                  memcpy(local_648,"check failed: (is_keyval(rd.node))",0x23);
                  eVar12 = get_error_flags();
                  if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                    trap_instruction();
                  }
                  p_Var1 = (in_RDI->m_callbacks).m_error;
                  Location::Location((Location *)in_stack_fffffffffffff400,
                                     (char *)in_stack_fffffffffffff3f8,
                                     CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                     CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                     CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
                  in_stack_fffffffffffff3e8 = (undefined4)local_660;
                  in_stack_fffffffffffff3ec = (undefined4)((ulong)local_660 >> 0x20);
                  in_stack_fffffffffffff3f0 = (undefined4)uStack_658;
                  in_stack_fffffffffffff3f4 = (undefined4)((ulong)uStack_658 >> 0x20);
                  in_stack_fffffffffffff3d8 = (undefined4)local_670;
                  in_stack_fffffffffffff3dc = (undefined4)((ulong)local_670 >> 0x20);
                  in_stack_fffffffffffff3e0 = (undefined4)uStack_668;
                  in_stack_fffffffffffff3e4 = (undefined4)((ulong)uStack_668 >> 0x20);
                  LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
                  LVar4.super_LineCol.offset = local_670;
                  LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
                  LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
                  LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
                  LVar4.name.str._0_4_ = in_stack_fffffffffffff3f0;
                  LVar4.name.str._4_4_ = in_stack_fffffffffffff3f4;
                  LVar4.name.len = (size_t)local_650;
                  in_stack_fffffffffffff3f8 = local_650;
                  (*p_Var1)(local_648,0x23,LVar4,(in_RDI->m_callbacks).m_user_data);
                }
                local_678 = parent((Tree *)CONCAT44(in_stack_fffffffffffff3e4,
                                                    in_stack_fffffffffffff3e0),
                                   CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
                local_680 = prev_sibling((Tree *)CONCAT44(in_stack_fffffffffffff3e4,
                                                          in_stack_fffffffffffff3e0),
                                         CONCAT44(in_stack_fffffffffffff3dc,
                                                  in_stack_fffffffffffff3d8));
                duplicate_children_no_rep
                          ((Tree *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                           CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                           CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                           CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
                remove(in_RDI,(char *)local_5b8->node);
                goto LAB_0038f0c9;
              }
            }
          }
          local_100 = local_5b8;
          if (((local_5b8->type).type & KEYREF) == NOTYPE) {
            local_98 = local_5b8;
            if (((local_5b8->type).type & VALREF) == NOTYPE) {
              memcpy(local_938.m_tag_directives + 2,"check failed: (rd.type.is_val_ref())",0x25);
              eVar12 = get_error_flags();
              if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                trap_instruction();
              }
              p_Var1 = (in_RDI->m_callbacks).m_error;
              Location::Location((Location *)in_stack_fffffffffffff400,
                                 (char *)in_stack_fffffffffffff3f8,
                                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                 CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                 CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
              in_stack_fffffffffffff3e8 = SUB84(local_938.m_tag_directives[1].prefix.str,0);
              in_stack_fffffffffffff3ec =
                   (undefined4)((ulong)local_938.m_tag_directives[1].prefix.str >> 0x20);
              in_stack_fffffffffffff3f0 = (undefined4)local_938.m_tag_directives[1].prefix.len;
              in_stack_fffffffffffff3f4 =
                   (undefined4)(local_938.m_tag_directives[1].prefix.len >> 0x20);
              in_stack_fffffffffffff3d8 = SUB84(local_938.m_tag_directives[1].handle.str,0);
              in_stack_fffffffffffff3dc =
                   (undefined4)((ulong)local_938.m_tag_directives[1].handle.str >> 0x20);
              in_stack_fffffffffffff3e0 = (undefined4)local_938.m_tag_directives[1].handle.len;
              in_stack_fffffffffffff3e4 =
                   (undefined4)(local_938.m_tag_directives[1].handle.len >> 0x20);
              LVar10.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
              LVar10.super_LineCol.offset = (size_t)local_938.m_tag_directives[1].handle.str;
              LVar10.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
              LVar10.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
              LVar10.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
              LVar10.name.str._0_4_ = in_stack_fffffffffffff3f0;
              LVar10.name.str._4_4_ = in_stack_fffffffffffff3f4;
              LVar10.name.len = local_938.m_tag_directives[1].next_node_id;
              in_stack_fffffffffffff3f8 = (Tree *)local_938.m_tag_directives[1].next_node_id;
              (*p_Var1)((char *)(local_938.m_tag_directives + 2),0x25,LVar10,
                        (in_RDI->m_callbacks).m_user_data);
            }
            local_f8 = local_5b8->target;
            local_70 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            if (((local_70->m_type).type & (KEYANCH|KEY)) == (KEYANCH|KEY)) {
              pcVar15 = key_anchor(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
              pcVar16 = val_ref(in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438);
              local_938.m_tag_directives[0].prefix.len = (size_t)pcVar16->str;
              local_938.m_tag_directives[0].next_node_id = pcVar16->len;
              local_1f0 = (char *)local_938.m_tag_directives[0].prefix.len;
              local_1e8 = local_938.m_tag_directives[0].next_node_id;
              local_1e0 = pcVar15;
              local_1d8 = (char *)local_938.m_tag_directives[0].prefix.len;
              local_1d0 = local_938.m_tag_directives[0].next_node_id;
              local_18 = pcVar15;
              local_10 = (char *)local_938.m_tag_directives[0].prefix.len;
              local_8 = local_938.m_tag_directives[0].next_node_id;
              iVar13 = basic_substring<const_char>::compare
                                 (in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450,
                                  CONCAT17(in_stack_fffffffffffff44f,
                                           CONCAT16(in_stack_fffffffffffff44e,
                                                    in_stack_fffffffffffff448)));
              if (iVar13 == 0) {
                local_b8 = local_5b8->target;
                local_50 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
                if (((local_50->m_type).type & (STREAM|MAP)) != NOTYPE) {
                  memcpy(&local_938.m_callbacks.m_free,"check failed: !is_container(rd.target)",0x27
                        );
                  eVar12 = get_error_flags();
                  if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                    trap_instruction();
                  }
                  in_stack_fffffffffffff458 =
                       (basic_substring<const_char> *)(in_RDI->m_callbacks).m_error;
                  Location::Location((Location *)in_stack_fffffffffffff400,
                                     (char *)in_stack_fffffffffffff3f8,
                                     CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                     CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                     CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
                  in_stack_fffffffffffff3d8 = local_938.m_arena.str._0_4_;
                  in_stack_fffffffffffff3dc = local_938.m_arena.str._4_4_;
                  in_stack_fffffffffffff3e0 = (undefined4)local_938.m_arena.len;
                  in_stack_fffffffffffff3e4 = local_938.m_arena.len._4_4_;
                  in_stack_fffffffffffff3e8 = (undefined4)local_938.m_arena_pos;
                  in_stack_fffffffffffff3ec = local_938.m_arena_pos._4_4_;
                  in_stack_fffffffffffff3f0 = local_938.m_callbacks.m_user_data._0_4_;
                  in_stack_fffffffffffff3f4 = local_938.m_callbacks.m_user_data._4_4_;
                  in_stack_fffffffffffff3f8 = (Tree *)local_938.m_callbacks.m_allocate;
                  (*(code *)in_stack_fffffffffffff458)
                            (&local_938.m_callbacks.m_free,0x27,(in_RDI->m_callbacks).m_user_data);
                }
                local_178 = local_5b8->target;
                in_stack_fffffffffffff450 =
                     _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
                in_stack_fffffffffffff44f =
                     ((in_stack_fffffffffffff450->m_type).type & VAL) != NOTYPE;
                local_88 = in_stack_fffffffffffff450;
                if (!(bool)in_stack_fffffffffffff44f) {
                  memcpy(&local_938,"check failed: has_val(rd.target)",0x21);
                  eVar12 = get_error_flags();
                  if (((eVar12 & 1) != 0) &&
                     (in_stack_fffffffffffff44e = is_debugger_attached(),
                     (bool)in_stack_fffffffffffff44e)) {
                    trap_instruction();
                  }
                  in_stack_fffffffffffff438 = (Tree *)(in_RDI->m_callbacks).m_error;
                  in_stack_fffffffffffff440 = &local_938;
                  Location::Location((Location *)in_stack_fffffffffffff400,
                                     (char *)in_stack_fffffffffffff3f8,
                                     CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                     CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                     CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
                  in_stack_fffffffffffff3d8 = local_960;
                  in_stack_fffffffffffff3dc = uStack_95c;
                  in_stack_fffffffffffff3e0 = uStack_958;
                  in_stack_fffffffffffff3e4 = uStack_954;
                  in_stack_fffffffffffff3e8 = local_950;
                  in_stack_fffffffffffff3ec = uStack_94c;
                  in_stack_fffffffffffff3f0 = uStack_948;
                  in_stack_fffffffffffff3f4 = uStack_944;
                  in_stack_fffffffffffff3f8 = local_940;
                  (*(code *)in_stack_fffffffffffff438)
                            (in_stack_fffffffffffff440,0x21,(in_RDI->m_callbacks).m_user_data);
                }
                in_stack_fffffffffffff430 =
                     (Tree *)key(in_stack_fffffffffffff438,(size_t)in_stack_fffffffffffff430);
                in_stack_fffffffffffff428 =
                     _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
                sVar2 = in_stack_fffffffffffff430->m_cap;
                (in_stack_fffffffffffff428->m_val).scalar.str =
                     (char *)in_stack_fffffffffffff430->m_buf;
                (in_stack_fffffffffffff428->m_val).scalar.len = sVar2;
                _add_flags((Tree *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),
                           (size_t)in_stack_fffffffffffff400,(NodeType_e)in_stack_fffffffffffff3f8);
                goto LAB_0038f0c9;
              }
            }
            duplicate_contents((Tree *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)
                               ,CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                               0x38f0bd);
          }
          else {
            local_140 = local_5b8->node;
            local_108 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            if (((local_108->m_type).type & KEYREF) == NOTYPE) {
              memcpy(local_6a8,"check failed: (is_key_ref(rd.node))",0x24);
              eVar12 = get_error_flags();
              if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                trap_instruction();
              }
              p_Var1 = (in_RDI->m_callbacks).m_error;
              Location::Location((Location *)in_stack_fffffffffffff400,
                                 (char *)in_stack_fffffffffffff3f8,
                                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                 CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                 CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
              in_stack_fffffffffffff3e8 = (undefined4)local_6c0;
              in_stack_fffffffffffff3ec = (undefined4)((ulong)local_6c0 >> 0x20);
              in_stack_fffffffffffff3f0 = (undefined4)uStack_6b8;
              in_stack_fffffffffffff3f4 = (undefined4)((ulong)uStack_6b8 >> 0x20);
              in_stack_fffffffffffff3d8 = (undefined4)local_6d0;
              in_stack_fffffffffffff3dc = (undefined4)((ulong)local_6d0 >> 0x20);
              in_stack_fffffffffffff3e0 = (undefined4)uStack_6c8;
              in_stack_fffffffffffff3e4 = (undefined4)((ulong)uStack_6c8 >> 0x20);
              LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
              LVar5.super_LineCol.offset = local_6d0;
              LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
              LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
              LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
              LVar5.name.str._0_4_ = in_stack_fffffffffffff3f0;
              LVar5.name.str._4_4_ = in_stack_fffffffffffff3f4;
              LVar5.name.len = (size_t)local_6b0;
              in_stack_fffffffffffff3f8 = local_6b0;
              (*p_Var1)(local_6a8,0x24,LVar5,(in_RDI->m_callbacks).m_user_data);
            }
            local_e8 = local_5b8->target;
            local_78 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            if (((local_78->m_type).type & (KEYANCH|KEY)) != (KEYANCH|KEY)) {
              local_c8 = local_5b8->target;
              local_68 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
              bVar11 = false;
              if (((local_68->m_type).type & VALANCH) != NOTYPE) {
                bVar11 = ((local_68->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
              }
              if (!bVar11) {
                memcpy(local_718,
                       "check failed: (has_key_anchor(rd.target) || has_val_anchor(rd.target))",0x47
                      );
                eVar12 = get_error_flags();
                if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                  trap_instruction();
                }
                p_Var1 = (in_RDI->m_callbacks).m_error;
                Location::Location((Location *)in_stack_fffffffffffff400,
                                   (char *)in_stack_fffffffffffff3f8,
                                   CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                   CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                   CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
                in_stack_fffffffffffff3e8 = (undefined4)local_730;
                in_stack_fffffffffffff3ec = (undefined4)((ulong)local_730 >> 0x20);
                in_stack_fffffffffffff3f0 = (undefined4)uStack_728;
                in_stack_fffffffffffff3f4 = (undefined4)((ulong)uStack_728 >> 0x20);
                in_stack_fffffffffffff3d8 = (undefined4)local_740;
                in_stack_fffffffffffff3dc = (undefined4)((ulong)local_740 >> 0x20);
                in_stack_fffffffffffff3e0 = (undefined4)uStack_738;
                in_stack_fffffffffffff3e4 = (undefined4)((ulong)uStack_738 >> 0x20);
                LVar6.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
                LVar6.super_LineCol.offset = local_740;
                LVar6.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
                LVar6.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
                LVar6.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
                LVar6.name.str._0_4_ = in_stack_fffffffffffff3f0;
                LVar6.name.str._4_4_ = in_stack_fffffffffffff3f4;
                LVar6.name.len = (size_t)local_720;
                in_stack_fffffffffffff3f8 = local_720;
                (*p_Var1)(local_718,0x47,LVar6,(in_RDI->m_callbacks).m_user_data);
              }
            }
            local_d8 = local_5b8->target;
            local_60 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            bVar11 = false;
            if (((local_60->m_type).type & VALANCH) != NOTYPE) {
              bVar11 = ((local_60->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
            }
            if (bVar11) {
              pcVar15 = val_anchor(in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438);
              pcVar16 = key_ref(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
              local_750 = pcVar16->str;
              local_748 = pcVar16->len;
              local_1a0 = local_750;
              local_198 = local_748;
              local_190 = pcVar15;
              local_188 = local_750;
              local_180 = local_748;
              local_48 = pcVar15;
              local_40 = local_750;
              local_38 = local_748;
              iVar13 = basic_substring<const_char>::compare
                                 (in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450,
                                  CONCAT17(in_stack_fffffffffffff44f,
                                           CONCAT16(in_stack_fffffffffffff44e,
                                                    in_stack_fffffffffffff448)));
              if (iVar13 == 0) {
                local_a8 = local_5b8->target;
                local_58 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
                if (((local_58->m_type).type & (STREAM|MAP)) != NOTYPE) {
                  memcpy(local_778,"check failed: !is_container(rd.target)",0x27);
                  eVar12 = get_error_flags();
                  if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                    trap_instruction();
                  }
                  p_Var1 = (in_RDI->m_callbacks).m_error;
                  Location::Location((Location *)in_stack_fffffffffffff400,
                                     (char *)in_stack_fffffffffffff3f8,
                                     CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                     CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                     CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
                  in_stack_fffffffffffff3e8 = (undefined4)local_790;
                  in_stack_fffffffffffff3ec = (undefined4)((ulong)local_790 >> 0x20);
                  in_stack_fffffffffffff3f0 = (undefined4)uStack_788;
                  in_stack_fffffffffffff3f4 = (undefined4)((ulong)uStack_788 >> 0x20);
                  in_stack_fffffffffffff3d8 = (undefined4)local_7a0;
                  in_stack_fffffffffffff3dc = (undefined4)((ulong)local_7a0 >> 0x20);
                  in_stack_fffffffffffff3e0 = (undefined4)uStack_798;
                  in_stack_fffffffffffff3e4 = (undefined4)((ulong)uStack_798 >> 0x20);
                  LVar7.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
                  LVar7.super_LineCol.offset = local_7a0;
                  LVar7.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
                  LVar7.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
                  LVar7.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
                  LVar7.name.str._0_4_ = in_stack_fffffffffffff3f0;
                  LVar7.name.str._4_4_ = in_stack_fffffffffffff3f4;
                  LVar7.name.len = (size_t)local_780;
                  in_stack_fffffffffffff3f8 = local_780;
                  (*p_Var1)(local_778,0x27,LVar7,(in_RDI->m_callbacks).m_user_data);
                }
                local_168 = local_5b8->target;
                local_90 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
                if (((local_90->m_type).type & VAL) == NOTYPE) {
                  memcpy(local_7c8,"check failed: has_val(rd.target)",0x21);
                  eVar12 = get_error_flags();
                  if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                    trap_instruction();
                  }
                  p_Var1 = (in_RDI->m_callbacks).m_error;
                  Location::Location((Location *)in_stack_fffffffffffff400,
                                     (char *)in_stack_fffffffffffff3f8,
                                     CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                     CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                     CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
                  in_stack_fffffffffffff3e8 = (undefined4)local_7e0;
                  in_stack_fffffffffffff3ec = (undefined4)((ulong)local_7e0 >> 0x20);
                  in_stack_fffffffffffff3f0 = (undefined4)uStack_7d8;
                  in_stack_fffffffffffff3f4 = (undefined4)((ulong)uStack_7d8 >> 0x20);
                  in_stack_fffffffffffff3d8 = (undefined4)local_7f0;
                  in_stack_fffffffffffff3dc = (undefined4)((ulong)local_7f0 >> 0x20);
                  in_stack_fffffffffffff3e0 = (undefined4)uStack_7e8;
                  in_stack_fffffffffffff3e4 = (undefined4)((ulong)uStack_7e8 >> 0x20);
                  LVar8.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
                  LVar8.super_LineCol.offset = local_7f0;
                  LVar8.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
                  LVar8.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
                  LVar8.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
                  LVar8.name.str._0_4_ = in_stack_fffffffffffff3f0;
                  LVar8.name.str._4_4_ = in_stack_fffffffffffff3f4;
                  LVar8.name.len = (size_t)local_7d0;
                  in_stack_fffffffffffff3f8 = local_7d0;
                  (*p_Var1)(local_7c8,0x21,LVar8,(in_RDI->m_callbacks).m_user_data);
                }
                pcVar15 = val(in_stack_fffffffffffff438,(size_t)in_stack_fffffffffffff430);
                pNVar14 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
                sVar2 = pcVar15->len;
                (pNVar14->m_key).scalar.str = pcVar15->str;
                (pNVar14->m_key).scalar.len = sVar2;
                _add_flags((Tree *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),
                           (size_t)in_stack_fffffffffffff400,(NodeType_e)in_stack_fffffffffffff3f8);
                goto LAB_0038f0c9;
              }
            }
            pcVar15 = key_anchor(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            pcVar16 = key_ref(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            local_800 = pcVar16->str;
            local_7f8 = pcVar16->len;
            local_1c8 = local_800;
            local_1c0 = local_7f8;
            local_1b8 = pcVar15;
            local_1b0 = local_800;
            local_1a8 = local_7f8;
            local_30 = pcVar15;
            local_28 = local_800;
            local_20 = local_7f8;
            iVar13 = basic_substring<const_char>::compare
                               (in_stack_fffffffffffff458,(char *)in_stack_fffffffffffff450,
                                CONCAT17(in_stack_fffffffffffff44f,
                                         CONCAT16(in_stack_fffffffffffff44e,
                                                  in_stack_fffffffffffff448)));
            if (iVar13 != 0) {
              memcpy(local_838,"check failed: key_anchor(rd.target) == key_ref(rd.node)",0x38);
              eVar12 = get_error_flags();
              if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                trap_instruction();
              }
              p_Var1 = (in_RDI->m_callbacks).m_error;
              Location::Location((Location *)in_stack_fffffffffffff400,
                                 (char *)in_stack_fffffffffffff3f8,
                                 CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                 CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                 CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
              in_stack_fffffffffffff3e8 = SUB84(local_938.m_tag_directives[3].prefix.str,0);
              in_stack_fffffffffffff3ec =
                   (undefined4)((ulong)local_938.m_tag_directives[3].prefix.str >> 0x20);
              in_stack_fffffffffffff3f0 = (undefined4)local_938.m_tag_directives[3].prefix.len;
              in_stack_fffffffffffff3f4 =
                   (undefined4)(local_938.m_tag_directives[3].prefix.len >> 0x20);
              in_stack_fffffffffffff3d8 = SUB84(local_938.m_tag_directives[3].handle.str,0);
              in_stack_fffffffffffff3dc =
                   (undefined4)((ulong)local_938.m_tag_directives[3].handle.str >> 0x20);
              in_stack_fffffffffffff3e0 = (undefined4)local_938.m_tag_directives[3].handle.len;
              in_stack_fffffffffffff3e4 =
                   (undefined4)(local_938.m_tag_directives[3].handle.len >> 0x20);
              LVar9.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
              LVar9.super_LineCol.offset = (size_t)local_938.m_tag_directives[3].handle.str;
              LVar9.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
              LVar9.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
              LVar9.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
              LVar9.name.str._0_4_ = in_stack_fffffffffffff3f0;
              LVar9.name.str._4_4_ = in_stack_fffffffffffff3f4;
              LVar9.name.len = local_938.m_tag_directives[3].next_node_id;
              in_stack_fffffffffffff3f8 = (Tree *)local_938.m_tag_directives[3].next_node_id;
              (*p_Var1)(local_838,0x38,LVar9,(in_RDI->m_callbacks).m_user_data);
            }
            pcVar15 = key(in_stack_fffffffffffff438,(size_t)in_stack_fffffffffffff430);
            pNVar14 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
            sVar2 = pcVar15->len;
            (pNVar14->m_key).scalar.str = pcVar15->str;
            (pNVar14->m_key).scalar.len = sVar2;
            _add_flags((Tree *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),
                       (size_t)in_stack_fffffffffffff400,(NodeType_e)in_stack_fffffffffffff3f8);
          }
        }
        else {
          local_208 = local_598->parent_ref;
          local_1f8 = _p(in_stack_fffffffffffff430,(size_t)in_stack_fffffffffffff428);
          if (((local_1f8->m_type).type & SEQ) == NOTYPE) {
            memcpy(local_5e8,"check failed: (is_seq(rd.parent_ref))",0x26);
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              trap_instruction();
            }
            p_Var1 = (in_RDI->m_callbacks).m_error;
            Location::Location((Location *)in_stack_fffffffffffff400,
                               (char *)in_stack_fffffffffffff3f8,
                               CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                               CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                               CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
            in_stack_fffffffffffff3e8 = (undefined4)local_600;
            in_stack_fffffffffffff3ec = (undefined4)((ulong)local_600 >> 0x20);
            in_stack_fffffffffffff3f0 = (undefined4)uStack_5f8;
            in_stack_fffffffffffff3f4 = (undefined4)((ulong)uStack_5f8 >> 0x20);
            in_stack_fffffffffffff3d8 = (undefined4)local_610;
            in_stack_fffffffffffff3dc = (undefined4)((ulong)local_610 >> 0x20);
            in_stack_fffffffffffff3e0 = (undefined4)uStack_608;
            in_stack_fffffffffffff3e4 = (undefined4)((ulong)uStack_608 >> 0x20);
            LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffff3e0;
            LVar3.super_LineCol.offset = local_610;
            LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffff3e4;
            LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffff3e8;
            LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffff3ec;
            LVar3.name.str._0_4_ = in_stack_fffffffffffff3f0;
            LVar3.name.str._4_4_ = in_stack_fffffffffffff3f4;
            LVar3.name.len = (size_t)local_5f0;
            in_stack_fffffffffffff3f8 = local_5f0;
            (*p_Var1)(local_5e8,0x26,LVar3,(in_RDI->m_callbacks).m_user_data);
          }
          local_620 = parent((Tree *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                             CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
          if (local_580 != local_5b8->parent_ref) {
            local_588 = local_5b8->parent_ref;
          }
          local_580 = local_5b8->parent_ref;
          local_618 = local_588;
          local_588 = duplicate_children_no_rep
                                ((Tree *)CONCAT44(in_stack_fffffffffffff3f4,
                                                  in_stack_fffffffffffff3f0),
                                 CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                                 CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                                 CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
          remove(in_RDI,(char *)local_5b8->node);
        }
      }
LAB_0038f0c9:
    }
    local_968 = &local_570;
    local_970 = detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::begin(local_968);
    local_978 = detail::stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::end(local_968);
    for (; local_970 != local_978; local_970 = local_970 + 1) {
      local_980 = local_970;
      rem_anchor_ref((Tree *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                     CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
      if (local_980->parent_ref != 0xffffffffffffffff) {
        local_988 = (NodeType_e)
                    type((Tree *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                         0x38f1a1);
        local_228 = &local_988;
        local_230 = 0;
        if (local_988 != NOTYPE) {
          remove(in_RDI,(char *)local_980->parent_ref);
        }
      }
    }
    detail::ReferenceResolver::~ReferenceResolver((ReferenceResolver *)0x38f23c);
  }
  return;
}

Assistant:

void Tree::resolve()
{
    if(m_size == 0)
        return;

    detail::ReferenceResolver rr(this);

    // insert the resolved references
    size_t prev_parent_ref = NONE;
    size_t prev_parent_ref_after = NONE;
    for(auto const& C4_RESTRICT rd : rr.refs)
    {
        if( ! rd.type.is_ref())
            continue;
        if(rd.parent_ref != NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, is_seq(rd.parent_ref));
            size_t after, p = parent(rd.parent_ref);
            if(prev_parent_ref != rd.parent_ref)
            {
                after = rd.parent_ref;//prev_sibling(rd.parent_ref_sibling);
                prev_parent_ref_after = after;
            }
            else
            {
                after = prev_parent_ref_after;
            }
            prev_parent_ref = rd.parent_ref;
            prev_parent_ref_after = duplicate_children_no_rep(rd.target, p, after);
            remove(rd.node);
        }
        else
        {
            if(has_key(rd.node) && is_key_ref(rd.node) && key(rd.node) == "<<")
            {
                _RYML_CB_ASSERT(m_callbacks, is_keyval(rd.node));
                size_t p = parent(rd.node);
                size_t after = prev_sibling(rd.node);
                duplicate_children_no_rep(rd.target, p, after);
                remove(rd.node);
            }
            else if(rd.type.is_key_ref())
            {
                _RYML_CB_ASSERT(m_callbacks, is_key_ref(rd.node));
                _RYML_CB_ASSERT(m_callbacks, has_key_anchor(rd.target) || has_val_anchor(rd.target));
                if(has_val_anchor(rd.target) && val_anchor(rd.target) == key_ref(rd.node))
                {
                    _RYML_CB_CHECK(m_callbacks, !is_container(rd.target));
                    _RYML_CB_CHECK(m_callbacks, has_val(rd.target));
                    _p(rd.node)->m_key.scalar = val(rd.target);
                    _add_flags(rd.node, KEY);
                }
                else
                {
                    _RYML_CB_CHECK(m_callbacks, key_anchor(rd.target) == key_ref(rd.node));
                    _p(rd.node)->m_key.scalar = key(rd.target);
                    _add_flags(rd.node, VAL);
                }
            }
            else
            {
                _RYML_CB_ASSERT(m_callbacks, rd.type.is_val_ref());
                if(has_key_anchor(rd.target) && key_anchor(rd.target) == val_ref(rd.node))
                {
                    _RYML_CB_CHECK(m_callbacks, !is_container(rd.target));
                    _RYML_CB_CHECK(m_callbacks, has_val(rd.target));
                    _p(rd.node)->m_val.scalar = key(rd.target);
                    _add_flags(rd.node, VAL);
                }
                else
                {
                    duplicate_contents(rd.target, rd.node);
                }
            }
        }
    }

    // clear anchors and refs
    for(auto const& C4_RESTRICT ar : rr.refs)
    {
        rem_anchor_ref(ar.node);
        if(ar.parent_ref != NONE)
            if(type(ar.parent_ref) != NOTYPE)
                remove(ar.parent_ref);
    }

}